

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardDemodulation.cpp
# Opt level: O0

void __thiscall
Inferences::ForwardDemodulation::attach(ForwardDemodulation *this,SaturationAlgorithm *salg)

{
  bool bVar1;
  int iVar2;
  Demodulation DVar3;
  DemodulationRedundancyCheck DVar4;
  SaturationAlgorithm *pSVar5;
  undefined4 extraout_var;
  SaturationAlgorithm *in_RSI;
  InferenceEngine *in_RDI;
  Options *opt;
  Options *in_stack_ffffffffffffffd8;
  DemodulationHelper *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  IndexType t;
  Options *this_00;
  
  t = (IndexType)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  InferenceEngine::attach(in_RDI,in_RSI);
  Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x7b1760);
  pSVar5 = (SaturationAlgorithm *)Indexing::IndexManager::request((IndexManager *)in_RSI,t);
  in_RDI[2]._salg = pSVar5;
  iVar2 = (*in_RDI->_vptr_InferenceEngine[4])();
  this_00 = (Options *)CONCAT44(extraout_var,iVar2);
  DVar3 = Shell::Options::forwardDemodulation(this_00);
  *(bool *)&in_RDI[1]._vptr_InferenceEngine = DVar3 == PREORDERED;
  DVar4 = Shell::Options::demodulationRedundancyCheck(this_00);
  *(bool *)((long)&in_RDI[1]._vptr_InferenceEngine + 1) = DVar4 == ENCOMPASS;
  bVar1 = Shell::Options::forwardDemodulationTermOrderingDiagrams(this_00);
  *(bool *)((long)&in_RDI[1]._vptr_InferenceEngine + 2) = bVar1;
  bVar1 = Shell::Options::demodulationOnlyEquational(this_00);
  *(bool *)((long)&in_RDI[1]._vptr_InferenceEngine + 3) = bVar1;
  Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x7b17fb);
  DemodulationHelper::DemodulationHelper
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Ordering *)in_RDI);
  in_RDI[1]._salg = (SaturationAlgorithm *)in_stack_ffffffffffffffd8;
  in_RDI[2]._vptr_InferenceEngine = (_func_int **)in_stack_ffffffffffffffe0;
  return;
}

Assistant:

void ForwardDemodulation::attach(SaturationAlgorithm* salg)
{
  ForwardSimplificationEngine::attach(salg);
  _index=static_cast<DemodulationLHSIndex*>(
	  _salg->getIndexManager()->request(DEMODULATION_LHS_CODE_TREE) );

  auto& opt = getOptions();
  _preorderedOnly = opt.forwardDemodulation()==Options::Demodulation::PREORDERED;
  _encompassing = opt.demodulationRedundancyCheck()==Options::DemodulationRedundancyCheck::ENCOMPASS;
  _useTermOrderingDiagrams = opt.forwardDemodulationTermOrderingDiagrams();
  _skipNonequationalLiterals = opt.demodulationOnlyEquational();
  _helper = DemodulationHelper(opt, &_salg->getOrdering());
}